

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_impl.cc
# Opt level: O3

void __thiscall
QuickImpl::ProcessPayload(QuickImpl *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  iterator iVar1;
  Location local_40;
  
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->_connections)._M_h,(key_type *)(data + 1));
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    QuickConnection::OnMessage
              (*(QuickConnection **)
                ((long)iVar1.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<QuickConnection,_std::default_delete<QuickConnection>_>_>,_false>
                       ._M_cur + 0x10),ip,port,data,data_len);
    return;
  }
  local_40._function_name = "ProcessPayload";
  local_40._file_name =
       "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc";
  local_40._line_number = 0x125;
  LogWrapper::Write(&g_quic_log,&local_40,2,anon_var_dwarf_7864a,(ulong)*(uint *)(data + 1));
  return;
}

Assistant:

void QuickImpl::ProcessPayload(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	QuickPayload *msg = (QuickPayload*)data;
	auto iter = _connections.find(msg->session_id);
	if (iter == _connections.end()) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "�Ҳ�����Ӧ��session id %u, �޷������� payload", msg->session_id);
		return;
	}
	iter->second->OnMessage(ip, port, data, data_len);
}